

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-fd.c
# Opt level: O1

int run_test_close_fd(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 *extraout_RDX;
  int64_t eval_b_1;
  int64_t eval_b_3;
  uv_os_fd_t fd [2];
  uv_pipe_t pipe_handle;
  uv_fs_t req;
  uv_os_fd_t local_2d0;
  uv_os_fd_t local_2cc;
  uv_buf_t local_2c8;
  uv_pipe_t local_2b0;
  uv_fs_t local_1c8;
  
  local_2c8 = uv_buf_init("",1);
  iVar1 = uv_pipe(&local_2d0,0,0);
  local_1c8.data = (void *)(long)iVar1;
  local_2b0.data = (void *)0x0;
  if (local_1c8.data == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar2,&local_2b0,0);
    local_1c8.data = (void *)(long)iVar1;
    if (local_1c8.data != (void *)0x0) goto LAB_0017fa2e;
    iVar1 = uv_pipe_open(&local_2b0,local_2d0);
    local_1c8.data = (void *)(long)iVar1;
    if (local_1c8.data != (void *)0x0) goto LAB_0017fa40;
    local_2d0 = -1;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&local_1c8,local_2cc,&local_2c8,1,-1,(uv_fs_cb)0x0);
    if (iVar1 != 1) goto LAB_0017fa52;
    if (local_1c8.result != 1) goto LAB_0017fa61;
    uv_fs_req_cleanup(&local_1c8);
    iVar1 = close(local_2cc);
    if (iVar1 != 0) goto LAB_0017fa70;
    local_2cc = -1;
    iVar1 = uv_read_start((uv_stream_t *)&local_2b0,alloc_cb,read_cb);
    if (iVar1 != 0) goto LAB_0017fa7f;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0017fa8e;
    if (read_cb_called != 1) goto LAB_0017fa9d;
    iVar1 = uv_is_active((uv_handle_t *)&local_2b0);
    if (iVar1 != 0) goto LAB_0017faac;
    iVar1 = uv_read_start((uv_stream_t *)&local_2b0,alloc_cb,read_cb);
    if (iVar1 != 0) goto LAB_0017fabb;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0017faca;
    if (read_cb_called != 2) goto LAB_0017fad9;
    iVar1 = uv_is_closing((uv_handle_t *)&local_2b0);
    if (iVar1 != 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017faf7;
    }
  }
  else {
    run_test_close_fd_cold_1();
LAB_0017fa2e:
    run_test_close_fd_cold_2();
LAB_0017fa40:
    run_test_close_fd_cold_3();
LAB_0017fa52:
    run_test_close_fd_cold_4();
LAB_0017fa61:
    run_test_close_fd_cold_5();
LAB_0017fa70:
    run_test_close_fd_cold_6();
LAB_0017fa7f:
    run_test_close_fd_cold_7();
LAB_0017fa8e:
    run_test_close_fd_cold_8();
LAB_0017fa9d:
    run_test_close_fd_cold_9();
LAB_0017faac:
    run_test_close_fd_cold_10();
LAB_0017fabb:
    run_test_close_fd_cold_11();
LAB_0017faca:
    run_test_close_fd_cold_12();
LAB_0017fad9:
    run_test_close_fd_cold_13();
  }
  run_test_close_fd_cold_15();
LAB_0017faf7:
  run_test_close_fd_cold_14();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 1;
  return 0x37fc34;
}

Assistant:

TEST_IMPL(close_fd) {
  uv_pipe_t pipe_handle;
  uv_fs_t req;
  uv_buf_t bufs[1];
  uv_os_fd_t fd[2];
  bufs[0] = uv_buf_init("", 1);

  ASSERT_OK(uv_pipe(fd, 0, 0));
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT_OK(uv_pipe_open(&pipe_handle, fd[0]));
  /* uv_pipe_open() takes ownership of the file descriptor. */
#ifdef _WIN32
  fd[0] = INVALID_HANDLE_VALUE;
#else
  fd[0] = -1;
#endif

  ASSERT_EQ(1, uv_fs_write(NULL, &req, fd[1], bufs, 1, -1, NULL));
  ASSERT_EQ(1, req.result);
  uv_fs_req_cleanup(&req);
#ifdef _WIN32
  ASSERT_NE(0, CloseHandle(fd[1]));
  fd[1] = INVALID_HANDLE_VALUE;
#else
  ASSERT_OK(close(fd[1]));
  fd[1] = -1;
#endif
  ASSERT_OK(uv_read_start((uv_stream_t *) &pipe_handle, alloc_cb, read_cb));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, read_cb_called);
  ASSERT_OK(uv_is_active((const uv_handle_t *) &pipe_handle));
  ASSERT_OK(uv_read_start((uv_stream_t *) &pipe_handle, alloc_cb, read_cb));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(2, read_cb_called);
  ASSERT_NE(0, uv_is_closing((const uv_handle_t *) &pipe_handle));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}